

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_pop(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int shift)

{
  JSValue **ppJVar1;
  int iVar2;
  BOOL BVar3;
  JSValueUnion JVar4;
  int64_t iVar5;
  JSValueUnion idx;
  JSValue obj;
  JSValue obj_00;
  JSValue v;
  JSValue val;
  uint32_t count32;
  JSValue *arrp;
  int64_t len;
  
  obj_00 = JS_ToObject(ctx,this_val);
  iVar2 = js_get_length64(ctx,&len,obj_00);
  if (iVar2 != 0) {
    v = (JSValue)(ZEXT816(3) << 0x40);
    goto LAB_0013988b;
  }
  if (len < 1) {
    v = (JSValue)(ZEXT816(3) << 0x40);
    idx.float64 = 0.0;
    iVar5 = 0;
LAB_001399f3:
    val.tag = iVar5;
    val.u.float64 = idx.float64;
    iVar2 = JS_SetProperty(ctx,obj_00,0x30,val);
    if (-1 < iVar2) goto LAB_0013989f;
  }
  else {
    idx.ptr = (void *)(len + -1);
    obj.tag = (int64_t)&arrp;
    obj.u = (JSValueUnion)(JSValueUnion)obj_00.tag;
    BVar3 = js_get_fast_array((JSContext *)obj_00.u.ptr,obj,(JSValue **)&count32,(uint32_t *)argv);
    if ((BVar3 != 0) && (len == (ulong)count32)) {
      if (shift == 0) {
        JVar4 = (JSValueUnion)arrp[count32 - 1].u.ptr;
        iVar5 = arrp[count32 - 1].tag;
      }
      else {
        JVar4 = (JSValueUnion)(arrp->u).ptr;
        iVar5 = arrp->tag;
        memmove(arrp,arrp + 1,(ulong)(count32 - 1) << 4);
      }
      v.tag = iVar5;
      v.u.float64 = JVar4.float64;
      ppJVar1 = (JSValue **)((long)obj_00.u.ptr + 0x40);
      *(int *)ppJVar1 = *(int *)ppJVar1 + -1;
LAB_001399cf:
      if ((ulong)len < 0x80000001) {
        iVar5 = 0;
      }
      else {
        idx.float64 = (double)(long)idx.ptr;
        iVar5 = 7;
      }
      goto LAB_001399f3;
    }
    if (shift == 0) {
      v = JS_GetPropertyInt64(ctx,obj_00,(int64_t)idx);
      if ((int)v.tag != 6) goto LAB_0013999a;
    }
    else {
      v = JS_GetPropertyInt64(ctx,obj_00,0);
      if (((int)v.tag != 6) && (iVar2 = JS_CopySubArray(ctx,obj_00,0,1,(int64_t)idx,1), iVar2 == 0))
      {
LAB_0013999a:
        iVar2 = JS_DeletePropertyInt64(ctx,obj_00,(int64_t)idx,0x4000);
        if (-1 < iVar2) goto LAB_001399cf;
      }
    }
  }
LAB_0013988b:
  JS_FreeValue(ctx,v);
  v = (JSValue)(ZEXT816(6) << 0x40);
LAB_0013989f:
  JS_FreeValue(ctx,obj_00);
  return v;
}

Assistant:

static JSValue js_array_pop(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv, int shift)
{
    JSValue obj, res = JS_UNDEFINED;
    int64_t len, newLen;
    JSValue *arrp;
    uint32_t count32;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;
    newLen = 0;
    if (len > 0) {
        newLen = len - 1;
        /* Special case fast arrays */
        if (js_get_fast_array(ctx, obj, &arrp, &count32) && count32 == len) {
            JSObject *p = JS_VALUE_GET_OBJ(obj);
            if (shift) {
                res = arrp[0];
                memmove(arrp, arrp + 1, (count32 - 1) * sizeof(*arrp));
                p->u.array.count--;
            } else {
                res = arrp[count32 - 1];
                p->u.array.count--;
            }
        } else {
            if (shift) {
                res = JS_GetPropertyInt64(ctx, obj, 0);
                if (JS_IsException(res))
                    goto exception;
                if (JS_CopySubArray(ctx, obj, 0, 1, len - 1, +1))
                    goto exception;
            } else {
                res = JS_GetPropertyInt64(ctx, obj, newLen);
                if (JS_IsException(res))
                    goto exception;
            }
            if (JS_DeletePropertyInt64(ctx, obj, newLen, JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    if (JS_SetProperty(ctx, obj, JS_ATOM_length, JS_NewInt64(ctx, newLen)) < 0)
        goto exception;

    JS_FreeValue(ctx, obj);
    return res;

 exception:
    JS_FreeValue(ctx, res);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}